

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  char **in_RSI;
  int in_EDI;
  int status;
  Application app;
  Application *in_stack_00000078;
  Application *in_stack_00000378;
  int local_54;
  Application *in_stack_ffffffffffffffb0;
  
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"This is a simple command line Force Feedback testing demo ...");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "All connected joystick devices will be created and if FF Support is found,"
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "you\'ll be able to play some predefined variable effects on them.");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "Note: 1 effect can be played on 1 joystick at a time for the moment.");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Application::Application((Application *)&stack0xffffffffffffffb0,in_EDI,in_RSI);
  local_54 = Application::initialize(in_stack_00000378);
  if (local_54 == 0) {
    Application::printHelp(in_stack_ffffffffffffffb0);
    local_54 = Application::run(in_stack_00000078);
  }
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Exiting ...");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(local_54);
}

Assistant:

int main(int argc, const char* argv[])
{

	cout << endl
		 << "This is a simple command line Force Feedback testing demo ..." << endl
		 << "All connected joystick devices will be created and if FF Support is found," << endl
		 << "you'll be able to play some predefined variable effects on them." << endl
		 << endl
		 << "Note: 1 effect can be played on 1 joystick at a time for the moment." << endl
		 << endl;

	Application app(argc, argv);

	int status = app.initialize();

	if(!status)
	{
		app.printHelp();

		status = app.run();
	}

	cout << endl
		 << endl
		 << "Exiting ..." << endl
		 << endl;

#if defined OIS_WIN32_PLATFORM && _DEBUG
	cout << "Click on this window and ..." << endl;
	system("pause");
#endif

	exit(status);
}